

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O0

convert_status __thiscall
crunch::display_file_info(crunch *this,uint32 file_index,uint32 num_files,char *pSrc_filename)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  pixel_format fmt;
  texture_type t;
  dynamic_string *pdVar9;
  char *pcVar10;
  char *pcVar11;
  uchar *puVar12;
  double dVar13;
  undefined8 in_stack_fffffffffffffdd8;
  undefined4 uVar14;
  float local_1c4;
  undefined1 local_110 [4];
  crn_bool success;
  crn_texture_info tex_info;
  double entropy;
  vector<unsigned_char> cmp_tex_bytes;
  lzma_codec lossless_codec;
  undefined1 local_b8 [4];
  uint32 compressed_size;
  vector<unsigned_char> src_tex_bytes;
  uint32 height;
  uint32 width;
  uint32 i;
  uint32 total_in_pixels;
  uint64 input_file_size;
  undefined1 local_80 [8];
  mipmapped_texture src_tex;
  format src_file_format;
  char *pSrc_filename_local;
  uint32 num_files_local;
  uint32 file_index_local;
  crunch *this_local;
  
  if (num_files < 2) {
    crnlib::console::message("Source texture: \"%s\"",pSrc_filename);
  }
  else {
    crnlib::console::message
              ("[%u/%u] Source texture: \"%s\"",(ulong)(file_index + 1),(ulong)num_files,
               pSrc_filename);
  }
  src_tex.m_last_error.m_pStr._4_4_ =
       crnlib::texture_file_types::determine_file_format(pSrc_filename);
  if (src_tex.m_last_error.m_pStr._4_4_ == cFormatInvalid) {
    crnlib::console::error("Unrecognized file type: %s",pSrc_filename);
    this_local._4_4_ = cCSFailed;
  }
  else {
    crnlib::mipmapped_texture::mipmapped_texture((mipmapped_texture *)local_80);
    bVar1 = crnlib::mipmapped_texture::read_from_file
                      ((mipmapped_texture *)local_80,pSrc_filename,src_tex.m_last_error.m_pStr._4_4_
                      );
    if (bVar1) {
      crnlib::file_utils::get_file_size(pSrc_filename,(uint64 *)&i);
      width = 0;
      height = 0;
      while( true ) {
        uVar4 = crnlib::mipmapped_texture::get_num_levels((mipmapped_texture *)local_80);
        uVar14 = (undefined4)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
        if (uVar4 <= height) break;
        uVar4 = crnlib::mipmapped_texture::get_width((mipmapped_texture *)local_80);
        src_tex_bytes.m_capacity =
             crnlib::math::maximum<unsigned_int>(1,uVar4 >> ((byte)height & 0x1f));
        uVar4 = crnlib::mipmapped_texture::get_height((mipmapped_texture *)local_80);
        src_tex_bytes.m_size = crnlib::math::maximum<unsigned_int>(1,uVar4 >> ((byte)height & 0x1f))
        ;
        iVar5 = src_tex_bytes.m_capacity * src_tex_bytes.m_size;
        uVar4 = crnlib::mipmapped_texture::get_num_faces((mipmapped_texture *)local_80);
        width = iVar5 * uVar4 + width;
        height = height + 1;
      }
      crnlib::vector<unsigned_char>::vector((vector<unsigned_char> *)local_b8);
      bVar1 = crnlib::cfile_stream::read_file_into_array
                        (pSrc_filename,(vector<unsigned_char> *)local_b8);
      if (bVar1) {
        uVar4 = crnlib::vector<unsigned_char>::size((vector<unsigned_char> *)local_b8);
        if (uVar4 == 0) {
          crnlib::console::warning("Source file is empty: %s",pSrc_filename);
          this_local._4_4_ = cCSSkipped;
        }
        else {
          lossless_codec.m_pUncompress._4_4_ = 0;
          bVar1 = crnlib::command_line_params::has_key(&this->m_params,"lzmastats");
          if (bVar1) {
            crnlib::lzma_codec::lzma_codec((lzma_codec *)&cmp_tex_bytes.m_size);
            crnlib::vector<unsigned_char>::vector((vector<unsigned_char> *)&entropy);
            puVar12 = crnlib::vector<unsigned_char>::get_ptr((vector<unsigned_char> *)local_b8);
            uVar4 = crnlib::vector<unsigned_char>::size((vector<unsigned_char> *)local_b8);
            bVar1 = crnlib::lzma_codec::pack
                              ((lzma_codec *)&cmp_tex_bytes.m_size,puVar12,uVar4,
                               (vector<unsigned_char> *)&entropy);
            if (bVar1) {
              lossless_codec.m_pUncompress._4_4_ =
                   crnlib::vector<unsigned_char>::size((vector<unsigned_char> *)&entropy);
            }
            crnlib::vector<unsigned_char>::~vector((vector<unsigned_char> *)&entropy);
            crnlib::lzma_codec::~lzma_codec((lzma_codec *)&cmp_tex_bytes.m_size);
          }
          uVar4 = crnlib::mipmapped_texture::get_width((mipmapped_texture *)local_80);
          uVar6 = crnlib::mipmapped_texture::get_height((mipmapped_texture *)local_80);
          uVar7 = crnlib::mipmapped_texture::get_num_levels((mipmapped_texture *)local_80);
          uVar8 = crnlib::mipmapped_texture::get_num_faces((mipmapped_texture *)local_80);
          fmt = crnlib::mipmapped_texture::get_format((mipmapped_texture *)local_80);
          pcVar10 = crnlib::pixel_format_helpers::get_pixel_format_string(fmt);
          bVar1 = crnlib::mipmapped_texture::is_packed((mipmapped_texture *)local_80);
          t = crnlib::mipmapped_texture::determine_texture_type((mipmapped_texture *)local_80);
          pcVar11 = crnlib::get_texture_type_desc(t);
          bVar2 = crnlib::mipmapped_texture::is_flipped((mipmapped_texture *)local_80);
          bVar3 = crnlib::mipmapped_texture::can_unflip_without_unpacking
                            ((mipmapped_texture *)local_80);
          crnlib::console::info
                    ("Source texture dimensions: %ux%u, Levels: %u, Faces: %u, Format: %s\nPacked Format: %u, Apparent Type: %s, Flipped: %u, Can Unflip Without Unpacking: %u"
                     ,(ulong)uVar4,(ulong)uVar6,(ulong)uVar7,(ulong)uVar8,pcVar10,bVar1,pcVar11,
                     CONCAT44(uVar14,(uint)bVar2),bVar3);
          uVar14 = (undefined4)((ulong)pcVar11 >> 0x20);
          local_1c4 = (float)_i;
          crnlib::console::info
                    ("Total pixels: %u, Source file size: %llu, Source file bits/pixel: %1.3f",
                     (double)((local_1c4 * 8.0) / (float)width),(ulong)width,_i);
          if (lossless_codec.m_pUncompress._4_4_ != 0) {
            crnlib::console::info
                      ("LZMA compressed file size: %u bytes, %1.3f bits/pixel",
                       (double)(((float)lossless_codec.m_pUncompress._4_4_ * 8.0) / (float)width),
                       (ulong)lossless_codec.m_pUncompress._4_4_);
          }
          puVar12 = crnlib::vector<unsigned_char>::get_ptr((vector<unsigned_char> *)local_b8);
          uVar4 = crnlib::vector<unsigned_char>::size((vector<unsigned_char> *)local_b8);
          dVar13 = crnlib::math::compute_entropy(puVar12,uVar4);
          tex_info.m_format = (crn_format)dVar13;
          uVar4 = crnlib::vector<unsigned_char>::size((vector<unsigned_char> *)local_b8);
          crnlib::console::info("Source file entropy: %3.6f bits per byte",dVar13 / (double)uVar4);
          if (src_tex.m_last_error.m_pStr._4_4_ == cFormatCRN) {
            crnd::crn_texture_info::crn_texture_info((crn_texture_info *)local_110);
            local_110 = (undefined1  [4])0x28;
            puVar12 = crnlib::vector<unsigned_char>::get_ptr((vector<unsigned_char> *)local_b8);
            uVar4 = crnlib::vector<unsigned_char>::size((vector<unsigned_char> *)local_b8);
            bVar1 = crnd::crnd_get_texture_info(puVar12,uVar4,(crn_texture_info *)local_110);
            if (bVar1) {
              crnlib::console::info("CRN texture info:");
              crnlib::console::info
                        ("Width: %u, Height: %u, Levels: %u, Faces: %u\nBytes per block: %u, User0: 0x%08X, User1: 0x%08X, CRN Format: %u"
                         ,(ulong)success,(ulong)tex_info.m_struct_size,(ulong)tex_info.m_width,
                         (ulong)tex_info.m_height,(ulong)tex_info.m_levels,tex_info.m_faces,
                         CONCAT44(uVar14,tex_info.m_bytes_per_block),tex_info._24_8_);
            }
            else {
              crnlib::console::error("Failed retrieving CRN texture info!");
            }
          }
          this_local._4_4_ = cCSSucceeded;
        }
      }
      else {
        crnlib::console::error("Failed loading source file: %s",pSrc_filename);
        this_local._4_4_ = cCSFailed;
      }
      input_file_size._0_4_ = 1;
      crnlib::vector<unsigned_char>::~vector((vector<unsigned_char> *)local_b8);
    }
    else {
      pdVar9 = crnlib::mipmapped_texture::get_last_error((mipmapped_texture *)local_80);
      bVar1 = crnlib::dynamic_string::is_empty(pdVar9);
      if (bVar1) {
        crnlib::console::error("Failed reading source file: \"%s\"",pSrc_filename);
      }
      else {
        pdVar9 = crnlib::mipmapped_texture::get_last_error((mipmapped_texture *)local_80);
        pcVar10 = crnlib::dynamic_string::get_ptr(pdVar9);
        crnlib::console::error("%s",pcVar10);
      }
      this_local._4_4_ = cCSFailed;
      input_file_size._0_4_ = 1;
    }
    crnlib::mipmapped_texture::~mipmapped_texture((mipmapped_texture *)local_80);
  }
  return this_local._4_4_;
}

Assistant:

convert_status display_file_info(uint32 file_index, uint32 num_files, const char* pSrc_filename)
    {
        if (num_files > 1)
        {
            console::message("[%u/%u] Source texture: \"%s\"", file_index + 1, num_files, pSrc_filename);
        }
        else
        {
            console::message("Source texture: \"%s\"", pSrc_filename);
        }

        texture_file_types::format src_file_format = texture_file_types::determine_file_format(pSrc_filename);
        if (src_file_format == texture_file_types::cFormatInvalid)
        {
            console::error("Unrecognized file type: %s", pSrc_filename);
            return cCSFailed;
        }

        mipmapped_texture src_tex;
        if (!src_tex.read_from_file(pSrc_filename, src_file_format))
        {
            if (src_tex.get_last_error().is_empty())
            {
                console::error("Failed reading source file: \"%s\"", pSrc_filename);
            }
            else
            {
                console::error("%s", src_tex.get_last_error().get_ptr());
            }

            return cCSFailed;
        }

        uint64 input_file_size;
        file_utils::get_file_size(pSrc_filename, input_file_size);

        uint32 total_in_pixels = 0;
        for (uint32 i = 0; i < src_tex.get_num_levels(); i++)
        {
            uint32 width = math::maximum<uint32>(1, src_tex.get_width() >> i);
            uint32 height = math::maximum<uint32>(1, src_tex.get_height() >> i);
            total_in_pixels += width * height * src_tex.get_num_faces();
        }

        vector<uint8> src_tex_bytes;
        if (!cfile_stream::read_file_into_array(pSrc_filename, src_tex_bytes))
        {
            console::error("Failed loading source file: %s", pSrc_filename);
            return cCSFailed;
        }

        if (!src_tex_bytes.size())
        {
            console::warning("Source file is empty: %s", pSrc_filename);
            return cCSSkipped;
        }

        uint32 compressed_size = 0;
        if (m_params.has_key("lzmastats"))
        {
            lzma_codec lossless_codec;
            vector<uint8> cmp_tex_bytes;
            if (lossless_codec.pack(src_tex_bytes.get_ptr(), src_tex_bytes.size(), cmp_tex_bytes))
            {
                compressed_size = cmp_tex_bytes.size();
            }
        }
        console::info("Source texture dimensions: %ux%u, Levels: %u, Faces: %u, Format: %s\nPacked Format: %u, Apparent Type: %s, Flipped: %u, Can Unflip Without Unpacking: %u",
            src_tex.get_width(),
            src_tex.get_height(),
            src_tex.get_num_levels(),
            src_tex.get_num_faces(),
            pixel_format_helpers::get_pixel_format_string(src_tex.get_format()),
            src_tex.is_packed(), get_texture_type_desc(src_tex.determine_texture_type()),
            src_tex.is_flipped(), src_tex.can_unflip_without_unpacking());

        console::info("Total pixels: %u, Source file size: " CRNLIB_UINT64_FORMAT_SPECIFIER ", Source file bits/pixel: %1.3f",
            total_in_pixels, input_file_size, (input_file_size * 8.0f) / total_in_pixels);
        if (compressed_size)
        {
            console::info("LZMA compressed file size: %u bytes, %1.3f bits/pixel",
                compressed_size, compressed_size * 8.0f / total_in_pixels);
        }

        double entropy = math::compute_entropy(src_tex_bytes.get_ptr(), src_tex_bytes.size());
        console::info("Source file entropy: %3.6f bits per byte", entropy / src_tex_bytes.size());

        if (src_file_format == texture_file_types::cFormatCRN)
        {
            crnd::crn_texture_info tex_info;
            tex_info.m_struct_size = sizeof(crnd::crn_texture_info);
            crn_bool success = crnd::crnd_get_texture_info(src_tex_bytes.get_ptr(), src_tex_bytes.size(), &tex_info);
            if (!success)
            {
                console::error("Failed retrieving CRN texture info!");
            }
            else
            {
                console::info("CRN texture info:");

                console::info("Width: %u, Height: %u, Levels: %u, Faces: %u\nBytes per block: %u, User0: 0x%08X, User1: 0x%08X, CRN Format: %u",
                    tex_info.m_width,
                    tex_info.m_height,
                    tex_info.m_levels,
                    tex_info.m_faces,
                    tex_info.m_bytes_per_block,
                    tex_info.m_userdata0,
                    tex_info.m_userdata1,
                    tex_info.m_format);
            }
        }

        return cCSSucceeded;
    }